

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O0

mg_point_2d * mg_point_2d_copy_ca(mg_point_2d *src,mg_allocator *allocator)

{
  mg_allocator *in_RSI;
  int64_t *in_RDI;
  mg_point_2d *point_2d;
  mg_point_2d *local_8;
  
  if (in_RDI == (int64_t *)0x0) {
    local_8 = (mg_point_2d *)0x0;
  }
  else {
    local_8 = mg_point_2d_alloc(in_RSI);
    if (local_8 == (mg_point_2d *)0x0) {
      local_8 = (mg_point_2d *)0x0;
    }
    else {
      local_8->srid = *in_RDI;
      local_8->x = (double)in_RDI[1];
      local_8->y = (double)in_RDI[2];
    }
  }
  return local_8;
}

Assistant:

mg_point_2d *mg_point_2d_copy_ca(const mg_point_2d *src,
                                 mg_allocator *allocator) {
  if (!src) {
    return NULL;
  }
  mg_point_2d *point_2d = mg_point_2d_alloc(allocator);
  if (!point_2d) {
    return NULL;
  }
  memcpy(point_2d, src, sizeof(mg_point_2d));
  return point_2d;
}